

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O2

void FACT_INTERNAL_ParseTrackEvents
               (uint8_t **ptr,uint8_t se,FACTTrack *track,FAudioMallocFunc pMalloc)

{
  undefined4 uVar1;
  byte bVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  ushort uVar5;
  uint uVar6;
  uint *puVar7;
  uint8_t *puVar8;
  ushort *puVar9;
  uint uVar10;
  FACTEvent *pFVar11;
  void *pvVar12;
  ulong uVar13;
  ushort uVar14;
  ulong uVar15;
  float fVar16;
  
  bVar2 = **ptr;
  *ptr = *ptr + 1;
  track->eventCount = bVar2;
  pFVar11 = (FACTEvent *)(*pMalloc)((ulong)bVar2 * 0x50);
  track->events = pFVar11;
  SDL_memset(pFVar11,0,(ulong)track->eventCount * 0x50);
  for (uVar15 = 0; uVar15 < track->eventCount; uVar15 = uVar15 + 1) {
    puVar7 = (uint *)*ptr;
    uVar5 = (ushort)puVar7[1];
    uVar6 = *puVar7;
    uVar10 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8;
    if (se == '\0') {
      uVar10 = uVar6;
    }
    *ptr = (uint8_t *)((long)puVar7 + 6);
    uVar14 = uVar5 << 8 | uVar5 >> 8;
    if (se == '\0') {
      uVar14 = uVar5;
    }
    pFVar11 = track->events;
    pFVar11[uVar15].randomOffset = uVar14;
    pFVar11[uVar15].type = (ushort)uVar10 & 0x1f;
    pFVar11[uVar15].timestamp = (uint16_t)(uVar10 >> 5);
    *ptr = (uint8_t *)((long)puVar7 + 7);
    pFVar11 = track->events;
    switch(pFVar11[uVar15].type) {
    case 0:
      uVar3 = *(uint8_t *)((long)puVar7 + 7);
      *ptr = (uint8_t *)(puVar7 + 2);
      track->events[uVar15].field_3.wave.flags = uVar3;
      break;
    case 1:
      pFVar11[uVar15].field_3.wave.isComplex = '\0';
      uVar3 = **ptr;
      *ptr = *ptr + 1;
      track->events[uVar15].field_3.wave.flags = uVar3;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      *(ushort *)((long)&track->events[uVar15].field_3 + 8) = uVar14;
      uVar3 = **ptr;
      *ptr = *ptr + 1;
      *(uint8_t *)((long)&track->events[uVar15].field_3 + 10) = uVar3;
      uVar3 = **ptr;
      *ptr = *ptr + 1;
      track->events[uVar15].field_3.wave.loopCount = uVar3;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.position = uVar14;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.angle = uVar14;
      track->events[uVar15].field_3.wave.variationFlags = 0;
      break;
    case 3:
      pFVar11[uVar15].field_3.wave.isComplex = '\x01';
      uVar3 = **ptr;
      *ptr = *ptr + 1;
      track->events[uVar15].field_3.wave.flags = uVar3;
      uVar3 = **ptr;
      *ptr = *ptr + 1;
      track->events[uVar15].field_3.wave.loopCount = uVar3;
      uVar5 = *(ushort *)*ptr;
      *ptr = (uint8_t *)((long)*ptr + 2);
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      track->events[uVar15].field_3.wave.position = uVar14;
      uVar5 = *(ushort *)*ptr;
      *ptr = (uint8_t *)((long)*ptr + 2);
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      track->events[uVar15].field_3.wave.angle = uVar14;
      uVar6 = *(uint *)*ptr;
      uVar10 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      if (se == '\0') {
        uVar10 = uVar6;
      }
      *ptr = (uint8_t *)((long)*ptr + 4);
      *(short *)((long)&track->events[uVar15].field_3 + 10) = (short)uVar10;
      *(short *)((long)&track->events[uVar15].field_3 + 8) = (short)(uVar10 >> 0x10);
      *ptr = *ptr + 4;
      pvVar12 = (*pMalloc)((ulong)*(ushort *)((long)&track->events[uVar15].field_3 + 10) * 2);
      *(void **)((long)&track->events[uVar15].field_3 + 0x10) = pvVar12;
      pvVar12 = (*pMalloc)((size_t)*(undefined2 *)((long)&track->events[uVar15].field_3 + 10));
      *(void **)((long)&track->events[uVar15].field_3 + 0x18) = pvVar12;
      pvVar12 = (*pMalloc)((size_t)*(undefined2 *)((long)&track->events[uVar15].field_3 + 10));
      *(void **)((long)&track->events[uVar15].field_3 + 0x20) = pvVar12;
      for (uVar13 = 0; uVar13 < *(ushort *)((long)&track->events[uVar15].field_3 + 10);
          uVar13 = uVar13 + 1) {
        puVar9 = (ushort *)*ptr;
        uVar5 = *puVar9;
        *ptr = (uint8_t *)(puVar9 + 1);
        uVar14 = uVar5 << 8 | uVar5 >> 8;
        if (se == '\0') {
          uVar14 = uVar5;
        }
        *(ushort *)(*(long *)((long)&track->events[uVar15].field_3 + 0x10) + uVar13 * 2) = uVar14;
        uVar5 = puVar9[1];
        *ptr = (uint8_t *)((long)puVar9 + 3);
        *(char *)(*(long *)((long)&track->events[uVar15].field_3 + 0x18) + uVar13) = (char)uVar5;
        puVar8 = *ptr;
        uVar3 = *puVar8;
        *ptr = puVar8 + 1;
        uVar4 = puVar8[1];
        *ptr = puVar8 + 2;
        *(uint8_t *)(*(long *)((long)&track->events[uVar15].field_3 + 0x20) + uVar13) =
             uVar4 - uVar3;
      }
      track->events[uVar15].field_3.wave.variationFlags = 0;
      break;
    case 4:
      pFVar11[uVar15].field_3.wave.isComplex = '\0';
      uVar3 = **ptr;
      *ptr = *ptr + 1;
      track->events[uVar15].field_3.wave.flags = uVar3;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      *(ushort *)((long)&track->events[uVar15].field_3 + 8) = uVar14;
      uVar3 = **ptr;
      *ptr = *ptr + 1;
      *(uint8_t *)((long)&track->events[uVar15].field_3 + 10) = uVar3;
      uVar3 = **ptr;
      *ptr = *ptr + 1;
      track->events[uVar15].field_3.wave.loopCount = uVar3;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.position = uVar14;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.angle = uVar14;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.minPitch = uVar14;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.maxPitch = uVar14;
      fVar16 = read_volbyte(ptr);
      track->events[uVar15].field_3.wave.minVolume = fVar16;
      fVar16 = read_volbyte(ptr);
      track->events[uVar15].field_3.wave.maxVolume = fVar16;
      fVar16 = *(float *)*ptr;
      *ptr = (uint8_t *)((long)*ptr + 4);
      track->events[uVar15].field_3.wave.minFrequency = fVar16;
      fVar16 = *(float *)*ptr;
      *ptr = (uint8_t *)((long)*ptr + 4);
      track->events[uVar15].field_3.wave.maxFrequency = fVar16;
      fVar16 = *(float *)*ptr;
      *ptr = (uint8_t *)((long)*ptr + 4);
      track->events[uVar15].field_3.wave.minQFactor = fVar16;
      fVar16 = *(float *)*ptr;
      *ptr = (uint8_t *)((long)*ptr + 4);
      track->events[uVar15].field_3.wave.maxQFactor = fVar16;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.variationFlags = uVar14;
      break;
    case 6:
      pFVar11[uVar15].field_3.wave.isComplex = '\x01';
      uVar3 = **ptr;
      *ptr = *ptr + 1;
      track->events[uVar15].field_3.wave.flags = uVar3;
      uVar3 = **ptr;
      *ptr = *ptr + 1;
      track->events[uVar15].field_3.wave.loopCount = uVar3;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.position = uVar14;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.angle = uVar14;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.minPitch = uVar14;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.maxPitch = uVar14;
      fVar16 = read_volbyte(ptr);
      track->events[uVar15].field_3.wave.minVolume = fVar16;
      fVar16 = read_volbyte(ptr);
      track->events[uVar15].field_3.wave.maxVolume = fVar16;
      fVar16 = *(float *)*ptr;
      *ptr = (uint8_t *)((long)*ptr + 4);
      track->events[uVar15].field_3.wave.minFrequency = fVar16;
      fVar16 = *(float *)*ptr;
      *ptr = (uint8_t *)((long)*ptr + 4);
      track->events[uVar15].field_3.wave.maxFrequency = fVar16;
      fVar16 = *(float *)*ptr;
      *ptr = (uint8_t *)((long)*ptr + 4);
      track->events[uVar15].field_3.wave.minQFactor = fVar16;
      fVar16 = *(float *)*ptr;
      *ptr = (uint8_t *)((long)*ptr + 4);
      track->events[uVar15].field_3.wave.maxQFactor = fVar16;
      uVar5 = *(ushort *)*ptr;
      *ptr = (uint8_t *)((long)*ptr + 2);
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      track->events[uVar15].field_3.wave.variationFlags = uVar14;
      uVar6 = *(uint *)*ptr;
      uVar10 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      if (se == '\0') {
        uVar10 = uVar6;
      }
      *ptr = (uint8_t *)((long)*ptr + 4);
      *(short *)((long)&track->events[uVar15].field_3 + 10) = (short)uVar10;
      *(short *)((long)&track->events[uVar15].field_3 + 8) = (short)(uVar10 >> 0x10);
      *ptr = *ptr + 4;
      pvVar12 = (*pMalloc)((ulong)*(ushort *)((long)&track->events[uVar15].field_3 + 10) * 2);
      *(void **)((long)&track->events[uVar15].field_3 + 0x10) = pvVar12;
      pvVar12 = (*pMalloc)((size_t)*(undefined2 *)((long)&track->events[uVar15].field_3 + 10));
      *(void **)((long)&track->events[uVar15].field_3 + 0x18) = pvVar12;
      pvVar12 = (*pMalloc)((size_t)*(undefined2 *)((long)&track->events[uVar15].field_3 + 10));
      *(void **)((long)&track->events[uVar15].field_3 + 0x20) = pvVar12;
      for (uVar13 = 0; uVar13 < *(ushort *)((long)&track->events[uVar15].field_3 + 10);
          uVar13 = uVar13 + 1) {
        puVar9 = (ushort *)*ptr;
        uVar5 = *puVar9;
        *ptr = (uint8_t *)(puVar9 + 1);
        uVar14 = uVar5 << 8 | uVar5 >> 8;
        if (se == '\0') {
          uVar14 = uVar5;
        }
        *(ushort *)(*(long *)((long)&track->events[uVar15].field_3 + 0x10) + uVar13 * 2) = uVar14;
        uVar5 = puVar9[1];
        *ptr = (uint8_t *)((long)puVar9 + 3);
        *(char *)(*(long *)((long)&track->events[uVar15].field_3 + 0x18) + uVar13) = (char)uVar5;
        puVar8 = *ptr;
        uVar3 = *puVar8;
        *ptr = puVar8 + 1;
        uVar4 = puVar8[1];
        *ptr = puVar8 + 2;
        *(uint8_t *)(*(long *)((long)&track->events[uVar15].field_3 + 0x20) + uVar13) =
             uVar4 - uVar3;
      }
      break;
    case 7:
    case 8:
    case 0x10:
    case 0x11:
      uVar3 = *(uint8_t *)((long)puVar7 + 7);
      *ptr = (uint8_t *)(puVar7 + 2);
      track->events[uVar15].field_3.wave.flags = uVar3;
      if ((track->events[uVar15].field_3.wave.flags & 1) == 0) {
        uVar3 = **ptr;
        *ptr = *ptr + 1;
        *(uint8_t *)((long)&track->events[uVar15].field_3 + 8) = uVar3;
        uVar1 = *(undefined4 *)*ptr;
        *ptr = *ptr + 4;
        *(undefined4 *)((long)&track->events[uVar15].field_3 + 0xc) = uVar1;
        uVar1 = *(undefined4 *)*ptr;
        *ptr = *ptr + 4;
        *(undefined4 *)((long)&track->events[uVar15].field_3 + 0x10) = uVar1;
        puVar8 = *ptr;
        *ptr = puVar8 + 5;
        if ((track->events[uVar15].type & 0xfffe) == 0x10) {
          uVar5 = *(ushort *)(puVar8 + 5);
          uVar14 = uVar5 << 8 | uVar5 >> 8;
          if (se == '\0') {
            uVar14 = uVar5;
          }
          *ptr = puVar8 + 7;
          track->events[uVar15].field_3.wave.position = uVar14;
          uVar5 = *(ushort *)*ptr;
          uVar14 = uVar5 << 8 | uVar5 >> 8;
          if (se == '\0') {
            uVar14 = uVar5;
          }
          *ptr = (uint8_t *)((long)*ptr + 2);
          track->events[uVar15].field_3.wave.angle = uVar14;
        }
        else {
          track->events[uVar15].field_3.wave.position = 0;
        }
      }
      else {
        track->events[uVar15].field_3.wave.position = 0;
        uVar1 = *(undefined4 *)*ptr;
        *ptr = *ptr + 4;
        *(undefined4 *)((long)&track->events[uVar15].field_3 + 8) = uVar1;
        fVar16 = *(float *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 4);
        *(float *)((long)&track->events[uVar15].field_3 + 0xc) = fVar16 * 100.0;
        uVar1 = *(undefined4 *)*ptr;
        *ptr = *ptr + 4;
        *(undefined4 *)((long)&track->events[uVar15].field_3 + 0x10) = uVar1;
        uVar5 = *(ushort *)*ptr;
        *ptr = (uint8_t *)((long)*ptr + 2);
        uVar14 = uVar5 << 8 | uVar5 >> 8;
        if (se == '\0') {
          uVar14 = uVar5;
        }
        *(ushort *)((long)&track->events[uVar15].field_3 + 0x14) = uVar14;
      }
      break;
    case 9:
      uVar6 = *(uint *)((long)puVar7 + 7);
      *ptr = (uint8_t *)((long)puVar7 + 0xb);
      uVar10 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      if (se == '\0') {
        uVar10 = uVar6;
      }
      track->events[uVar15].field_3.marker.marker = uVar10;
      track->events[uVar15].field_3.wave.angle = 0;
      track->events[uVar15].field_3.marker.frequency = 0;
      break;
    case 0x12:
      uVar6 = *(uint *)((long)puVar7 + 7);
      uVar10 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      if (se == '\0') {
        uVar10 = uVar6;
      }
      *ptr = (uint8_t *)((long)puVar7 + 0xb);
      track->events[uVar15].field_3.marker.marker = uVar10;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.wave.angle = uVar14;
      uVar5 = *(ushort *)*ptr;
      uVar14 = uVar5 << 8 | uVar5 >> 8;
      if (se == '\0') {
        uVar14 = uVar5;
      }
      *ptr = (uint8_t *)((long)*ptr + 2);
      track->events[uVar15].field_3.marker.frequency = uVar14;
    }
  }
  return;
}

Assistant:

void FACT_INTERNAL_ParseTrackEvents(
	uint8_t **ptr,
	uint8_t se,
	FACTTrack *track,
	FAudioMallocFunc pMalloc
) {
	uint32_t evtInfo;
	uint8_t minWeight, maxWeight, separator;
	uint8_t i;
	uint16_t j;

	track->eventCount = read_u8(ptr);
	track->events = (FACTEvent*) pMalloc(
		sizeof(FACTEvent) *
		track->eventCount
	);
	FAudio_zero(track->events, sizeof(FACTEvent) * track->eventCount);
	for (i = 0; i < track->eventCount; i += 1)
	{
		evtInfo = read_u32(ptr, se);
		track->events[i].randomOffset = read_u16(ptr, se);

		track->events[i].type = evtInfo & 0x001F;
		track->events[i].timestamp = (evtInfo >> 5) & 0xFFFF;

		separator = read_u8(ptr);
		FAudio_assert(separator == 0xFF); /* Separator? */

		#define EVTTYPE(t) (track->events[i].type == t)
		if (EVTTYPE(FACTEVENT_STOP))
		{
			track->events[i].stop.flags = read_u8(ptr);
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVE))
		{
			/* Basic Wave */
			track->events[i].wave.isComplex = 0;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.simple.track = read_u16(ptr, se);
			track->events[i].wave.simple.wavebank = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* No Effect Variation */
			track->events[i].wave.variationFlags = 0;
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVETRACKVARIATION))
		{
			/* Complex Wave */
			track->events[i].wave.isComplex = 1;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* Track Variation */
			evtInfo = read_u32(ptr, se);
			track->events[i].wave.complex.trackCount = evtInfo & 0xFFFF;
			track->events[i].wave.complex.variation = (evtInfo >> 16) & 0xFFFF;
			*ptr += 4; /* Unknown values */
			track->events[i].wave.complex.tracks = (uint16_t*) pMalloc(
				sizeof(uint16_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.wavebanks = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.weights = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			for (j = 0; j < track->events[i].wave.complex.trackCount; j += 1)
			{
				track->events[i].wave.complex.tracks[j] = read_u16(ptr, se);
				track->events[i].wave.complex.wavebanks[j] = read_u8(ptr);
				minWeight = read_u8(ptr);
				maxWeight = read_u8(ptr);
				track->events[i].wave.complex.weights[j] = (
					maxWeight - minWeight
				);
			}

			/* No Effect Variation */
			track->events[i].wave.variationFlags = 0;
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVEEFFECTVARIATION))
		{
			/* Basic Wave */
			track->events[i].wave.isComplex = 0;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.simple.track = read_u16(ptr, se);
			track->events[i].wave.simple.wavebank = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* Effect Variation */
			track->events[i].wave.minPitch = read_s16(ptr, se);
			track->events[i].wave.maxPitch = read_s16(ptr, se);
			track->events[i].wave.minVolume = read_volbyte(ptr);
			track->events[i].wave.maxVolume = read_volbyte(ptr);
			track->events[i].wave.minFrequency = read_f32(ptr, se);
			track->events[i].wave.maxFrequency = read_f32(ptr, se);
			track->events[i].wave.minQFactor = read_f32(ptr, se);
			track->events[i].wave.maxQFactor = read_f32(ptr, se);
			track->events[i].wave.variationFlags = read_u16(ptr, se);
		}
		else if (EVTTYPE(FACTEVENT_PLAYWAVETRACKEFFECTVARIATION))
		{
			/* Complex Wave */
			track->events[i].wave.isComplex = 1;
			track->events[i].wave.flags = read_u8(ptr);
			track->events[i].wave.loopCount = read_u8(ptr);
			track->events[i].wave.position = read_u16(ptr, se);
			track->events[i].wave.angle = read_u16(ptr, se);

			/* Effect Variation */
			track->events[i].wave.minPitch = read_s16(ptr, se);
			track->events[i].wave.maxPitch = read_s16(ptr, se);
			track->events[i].wave.minVolume = read_volbyte(ptr);
			track->events[i].wave.maxVolume = read_volbyte(ptr);
			track->events[i].wave.minFrequency = read_f32(ptr, se);
			track->events[i].wave.maxFrequency = read_f32(ptr, se);
			track->events[i].wave.minQFactor = read_f32(ptr, se);
			track->events[i].wave.maxQFactor = read_f32(ptr, se);
			track->events[i].wave.variationFlags = read_u16(ptr, se);

			/* Track Variation */
			evtInfo = read_u32(ptr, se);
			track->events[i].wave.complex.trackCount = evtInfo & 0xFFFF;
			track->events[i].wave.complex.variation = (evtInfo >> 16) & 0xFFFF;
			*ptr += 4; /* Unknown values */
			track->events[i].wave.complex.tracks = (uint16_t*) pMalloc(
				sizeof(uint16_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.wavebanks = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			track->events[i].wave.complex.weights = (uint8_t*) pMalloc(
				sizeof(uint8_t) *
				track->events[i].wave.complex.trackCount
			);
			for (j = 0; j < track->events[i].wave.complex.trackCount; j += 1)
			{
				track->events[i].wave.complex.tracks[j] = read_u16(ptr, se);
				track->events[i].wave.complex.wavebanks[j] = read_u8(ptr);
				minWeight = read_u8(ptr);
				maxWeight = read_u8(ptr);
				track->events[i].wave.complex.weights[j] = (
					maxWeight - minWeight
				);
			}
		}
		else if (	EVTTYPE(FACTEVENT_PITCH) ||
				EVTTYPE(FACTEVENT_VOLUME) ||
				EVTTYPE(FACTEVENT_PITCHREPEATING) ||
				EVTTYPE(FACTEVENT_VOLUMEREPEATING)	)
		{
			track->events[i].value.settings = read_u8(ptr);
			if (track->events[i].value.settings & 1) /* Ramp */
			{
				track->events[i].value.repeats = 0;
				track->events[i].value.ramp.initialValue = read_f32(ptr, se);
				track->events[i].value.ramp.initialSlope = read_f32(ptr, se) * 100;
				track->events[i].value.ramp.slopeDelta = read_f32(ptr, se);
				track->events[i].value.ramp.duration = read_u16(ptr, se);
			}
			else /* Equation */
			{
				track->events[i].value.equation.flags = read_u8(ptr);

				/* SetValue, SetRandomValue, anything else? */
				FAudio_assert(track->events[i].value.equation.flags & 0x0C);

				track->events[i].value.equation.value1 = read_f32(ptr, se);
				track->events[i].value.equation.value2 = read_f32(ptr, se);

				*ptr += 5; /* Unknown values */

				if (	EVTTYPE(FACTEVENT_PITCHREPEATING) ||
					EVTTYPE(FACTEVENT_VOLUMEREPEATING)	)
				{
					track->events[i].value.repeats = read_u16(ptr, se);
					track->events[i].value.frequency = read_u16(ptr, se);
				}
				else
				{
					track->events[i].value.repeats = 0;
				}
			}
		}
		else if (EVTTYPE(FACTEVENT_MARKER))
		{
			track->events[i].marker.marker = read_u32(ptr, se);
			track->events[i].marker.repeats = 0;
			track->events[i].marker.frequency = 0;
		}
		else if (EVTTYPE(FACTEVENT_MARKERREPEATING))
		{
			track->events[i].marker.marker = read_u32(ptr, se);
			track->events[i].marker.repeats = read_u16(ptr, se);
			track->events[i].marker.frequency = read_u16(ptr, se);
		}
		else
		{
			FAudio_assert(0 && "Unknown event type!");
		}
		#undef EVTTYPE
	}
}